

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O1

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromConstTriplets
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *this,Triplets *triplets)

{
  Triplets copy;
  Triplets local_28;
  
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::vector
            (&local_28.m_triplets,&triplets->m_triplets);
  setFromTriplets(this,&local_28);
  if (local_28.m_triplets.super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.m_triplets.
                    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.m_triplets.
                          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.m_triplets.
                          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SparseMatrix<ordering>::setFromConstTriplets(const iDynTree::Triplets& triplets)
    {
        iDynTree::Triplets copy(triplets);
        setFromTriplets(copy);
    }